

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_CallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ValidateRegValue(this,*(Var *)(this + (ulong)(playout->
                                               super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                               ).
                                               super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                               .Function * 8 + 0x160),true,true);
}

Assistant:

void OP_CallIExtended(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }